

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::load(CDT *this,string *filepath)

{
  ifstream file;
  byte abStack_1f0 [488];
  
  std::ifstream::ifstream(&file,(string *)filepath,_S_in);
  if ((abStack_1f0[*(long *)(_file + -0x18)] & 5) == 0) {
    std::ifstream::close();
    std::ifstream::~ifstream(&file);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [loading model]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void CDT::load(const std::string& filepath){
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading model]: Couldn't open up the file!\n";
        exit(1);
    }

    // TO DO

    file.close();
}